

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

char * __thiscall rtosc::Port::MetaContainer::operator[](MetaContainer *this,char *str)

{
  int iVar1;
  char *__s1;
  MetaIterator __begin1;
  MetaIterator local_48;
  MetaIterator local_38;
  
  local_48 = begin(this);
  __s1 = local_48.title;
  MetaIterator::MetaIterator(&local_38,(char *)0x0);
  while( true ) {
    if (__s1 == local_38.title) {
      return (char *)0x0;
    }
    iVar1 = strcmp(__s1,str);
    if (iVar1 == 0) break;
    MetaIterator::operator++(&local_48);
    __s1 = local_48.title;
  }
  return local_48.value;
}

Assistant:

const char *Port::MetaContainer::operator[](const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x.value;
    return NULL;
}